

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O2

void SetupMapping(aiMaterial *mat,aiTextureMapping mode,aiVector3D *axis)

{
  int iVar1;
  aiMaterialProperty *paVar2;
  aiTextureMapping *paVar3;
  char *pcVar4;
  aiMaterialProperty **__dest;
  uint i;
  ulong uVar5;
  pointer __src;
  ulong uVar6;
  aiMaterialProperty *m;
  aiMaterialProperty *prop;
  vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_> p;
  
  p.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  p.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::reserve
            (&p,(ulong)(mat->mNumProperties + 1));
  for (uVar5 = 0; uVar5 < mat->mNumProperties; uVar5 = uVar5 + 1) {
    paVar2 = mat->mProperties[uVar5];
    pcVar4 = (paVar2->mKey).data;
    prop = paVar2;
    iVar1 = strcmp(pcVar4,"$tex.file");
    if (iVar1 == 0) {
      paVar2 = (aiMaterialProperty *)operator_new(0x420);
      aiMaterialProperty::aiMaterialProperty(paVar2);
      m = paVar2;
      aiString::Set((aiString *)paVar2,"$tex.mapping");
      paVar2 = m;
      m->mIndex = prop->mIndex;
      m->mSemantic = prop->mSemantic;
      m->mDataLength = 4;
      m->mType = aiPTI_Integer;
      paVar3 = (aiTextureMapping *)operator_new__(4);
      paVar2->mData = (char *)paVar3;
      *paVar3 = mode;
      std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::push_back(&p,&prop);
      std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::push_back(&p,&m);
      if ((mode < aiTextureMapping_OTHER) && ((0x16U >> (mode & 0x1f) & 1) != 0)) {
        paVar2 = (aiMaterialProperty *)operator_new(0x420);
        aiMaterialProperty::aiMaterialProperty(paVar2);
        m = paVar2;
        aiString::Set((aiString *)paVar2,"$tex.mapaxis");
        paVar2 = m;
        m->mIndex = prop->mIndex;
        m->mSemantic = prop->mSemantic;
        m->mDataLength = 0xc;
        m->mType = aiPTI_Float;
        pcVar4 = (char *)operator_new__(0xc);
        paVar2->mData = pcVar4;
        *(float *)(pcVar4 + 8) = axis->z;
        *(undefined8 *)pcVar4 = *(undefined8 *)axis;
        std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::push_back(&p,&m);
      }
    }
    else {
      iVar1 = strcmp(pcVar4,"$tex.uvwsrc");
      if (iVar1 == 0) {
        if (paVar2 != (aiMaterialProperty *)0x0) {
          aiMaterialProperty::~aiMaterialProperty(paVar2);
        }
        operator_delete(paVar2,0x420);
      }
      else {
        std::vector<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::push_back
                  (&p,&prop);
      }
    }
  }
  if (p.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      p.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar6 = (long)p.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)p.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)uVar6 >> 3;
    __dest = mat->mProperties;
    __src = p.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
    if (mat->mNumAllocated < uVar5) {
      if (__dest != (aiMaterialProperty **)0x0) {
        operator_delete__(__dest);
        uVar6 = (long)p.
                      super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)p.
                      super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = (long)uVar6 >> 3;
      }
      __src = p.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
      __dest = (aiMaterialProperty **)
               operator_new__(-(ulong)((uVar5 & 0x7000000000000000) != 0) | uVar6 * 2);
      mat->mProperties = __dest;
      mat->mNumAllocated = (int)uVar5 * 2;
    }
    mat->mNumProperties = (uint)(uVar6 >> 3);
    memcpy(__dest,__src,uVar6 & 0x7fffffff8);
  }
  std::_Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>::~_Vector_base
            (&p.super__Vector_base<aiMaterialProperty_*,_std::allocator<aiMaterialProperty_*>_>);
  return;
}

Assistant:

void SetupMapping (aiMaterial* mat, aiTextureMapping mode, const aiVector3D& axis = aiVector3D(0.f,0.f,-1.f))
{
    // Check whether there are texture properties defined - setup
    // the desired texture mapping mode for all of them and ignore
    // all UV settings we might encounter. WE HAVE NO UVS!

    std::vector<aiMaterialProperty*> p;
    p.reserve(mat->mNumProperties+1);

    for (unsigned int i = 0; i < mat->mNumProperties;++i)
    {
        aiMaterialProperty* prop = mat->mProperties[i];
        if (!::strcmp( prop->mKey.data, "$tex.file"))   {
            // Setup the mapping key
            aiMaterialProperty* m = new aiMaterialProperty();
            m->mKey.Set("$tex.mapping");
            m->mIndex    = prop->mIndex;
            m->mSemantic = prop->mSemantic;
            m->mType     = aiPTI_Integer;

            m->mDataLength = 4;
            m->mData = new char[4];
            *((int*)m->mData) = mode;

            p.push_back(prop);
            p.push_back(m);

            // Setup the mapping axis
            if (mode == aiTextureMapping_CYLINDER || mode == aiTextureMapping_PLANE || mode == aiTextureMapping_SPHERE) {
                m = new aiMaterialProperty();
                m->mKey.Set("$tex.mapaxis");
                m->mIndex    = prop->mIndex;
                m->mSemantic = prop->mSemantic;
                m->mType     = aiPTI_Float;

                m->mDataLength = 12;
                m->mData = new char[12];
                *((aiVector3D*)m->mData) = axis;
                p.push_back(m);
            }
        }
        else if (! ::strcmp( prop->mKey.data, "$tex.uvwsrc"))   {
            delete mat->mProperties[i];
        }
        else p.push_back(prop);
    }

    if (p.empty())return;

    // rebuild the output array
    if (p.size() > mat->mNumAllocated)  {
        delete[] mat->mProperties;
        mat->mProperties = new aiMaterialProperty*[p.size()*2];

        mat->mNumAllocated = static_cast<unsigned int>(p.size()*2);
    }
    mat->mNumProperties = (unsigned int)p.size();
    ::memcpy(mat->mProperties,&p[0],sizeof(void*)*mat->mNumProperties);
}